

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

int secp256k1_modinv32_mul_cmp_30
              (secp256k1_modinv32_signed30 *a,int alen,secp256k1_modinv32_signed30 *b,int32_t factor
              )

{
  secp256k1_modinv32_signed30 bm;
  secp256k1_modinv32_signed30 am;
  int i;
  int local_70 [4];
  int32_t in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffffa8;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffffb0;
  int local_28;
  
  secp256k1_modinv32_mul_30
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
             in_stack_ffffffffffffffa0);
  secp256k1_modinv32_mul_30
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
             in_stack_ffffffffffffffa0);
  local_28 = 0;
  while( true ) {
    if (7 < local_28) {
      local_28 = 8;
      while( true ) {
        if (local_28 < 0) {
          return 0;
        }
        if (*(int *)(&stack0xffffffffffffffb4 + (long)local_28 * 4) < local_70[local_28]) break;
        if (local_70[local_28] < *(int *)(&stack0xffffffffffffffb4 + (long)local_28 * 4)) {
          return 1;
        }
        local_28 = local_28 + -1;
      }
      return -1;
    }
    if (*(int *)(&stack0xffffffffffffffb4 + (long)local_28 * 4) >> 0x1e != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modinv32_impl.h"
              ,0x30,"test condition failed: am.v[i] >> 30 == 0");
      abort();
    }
    if (local_70[local_28] >> 0x1e != 0) break;
    local_28 = local_28 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modinv32_impl.h"
          ,0x31,"test condition failed: bm.v[i] >> 30 == 0");
  abort();
}

Assistant:

static int secp256k1_modinv32_mul_cmp_30(const secp256k1_modinv32_signed30 *a, int alen, const secp256k1_modinv32_signed30 *b, int32_t factor) {
    int i;
    secp256k1_modinv32_signed30 am, bm;
    secp256k1_modinv32_mul_30(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv32_mul_30(&bm, b, 9, factor);
    for (i = 0; i < 8; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 30 == 0);
        VERIFY_CHECK(bm.v[i] >> 30 == 0);
    }
    for (i = 8; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}